

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  short sVar1;
  ulong *puVar2;
  char *pcVar3;
  Table *pTVar4;
  i16 *piVar5;
  short sVar6;
  LogEst LVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong in_RSI;
  Index *in_RDI;
  long in_FS_OFFSET;
  WhereTerm *pTerm_1;
  WhereClause *pWC2;
  int iCur;
  int ii;
  LogEst nLookup;
  u32 isCov;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  LogEst rLogSize;
  Index *pFirst;
  Table *pTab;
  WhereClause *pWC;
  LogEst rSize;
  int b;
  int iSortIdx;
  int rc;
  WhereLoop *pNew;
  SrcItem *pSrc;
  SrcList *pTabList;
  Index *pProbe;
  WhereInfo *pWInfo;
  Bitmask m;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  Index *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  Index *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffedf;
  WhereClause *in_stack_fffffffffffffee0;
  WhereLoop *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined2 in_stack_fffffffffffffef8;
  LogEst in_stack_fffffffffffffefa;
  u32 in_stack_fffffffffffffefc;
  Index *in_stack_ffffffffffffff00;
  Index *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  LogEst in_stack_ffffffffffffff16;
  int local_c8;
  int local_c4;
  Index *local_a8;
  SrcItem *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  i16 iVar12;
  LogEst LVar13;
  undefined2 uVar14;
  Index local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_78,0xaa,0x70);
  LVar13 = -0x5556;
  uVar14 = 0xaaaa;
  iVar12 = -1;
  local_c4 = 0;
  local_c8 = 1;
  puVar2 = (ulong *)in_RDI->aiRowLogEst;
  pcVar3 = in_RDI->zName;
  lVar10 = *(long *)(pcVar3 + 8) + 8 + (long)(int)(uint)(byte)puVar2[2] * 0x48;
  pTVar4 = *(Table **)(lVar10 + 0x10);
  piVar5 = in_RDI->aiColumn;
  if ((*(ushort *)(lVar10 + 0x19) >> 1 & 1) == 0) {
    if ((pTVar4->tabFlags & 0x80) == 0) {
      memset(&local_78,0,0x70);
      local_78.nKeyCol = 1;
      local_78.nColumn = 1;
      local_78.aiColumn = (i16 *)&stack0xffffffffffffff82;
      local_78.aiRowLogEst = (LogEst *)&stack0xffffffffffffff84;
      local_78.onError = '\x05';
      local_78.szIdxRow = 3;
      local_78._99_2_ = local_78._99_2_ & 0xfffc | 3;
      LVar13 = pTVar4->nRowLogEst;
      uVar14 = 0;
      if ((*(ushort *)(lVar10 + 0x19) & 1) == 0) {
        local_78.pNext = *(Index **)(*(long *)(lVar10 + 0x10) + 0x10);
      }
      local_a8 = &local_78;
      local_78.pTable = pTVar4;
    }
    else {
      local_a8 = pTVar4->pIndex;
    }
  }
  else {
    local_a8 = *(Index **)(lVar10 + 0x30);
  }
  sVar1 = pTVar4->nRowLogEst;
  if ((((((in_RDI->pTable == (Table *)0x0) && ((*(ushort *)(pcVar3 + 0x3c) & 0x1020) == 0)) &&
        ((*(ulong *)(**(long **)pcVar3 + 0x30) & 0x8000) != 0)) &&
       (((*(ushort *)(lVar10 + 0x19) >> 1 & 1) == 0 && ((*(ushort *)(lVar10 + 0x19) & 1) == 0)))) &&
      ((*(ushort *)(lVar10 + 0x19) >> 4 & 1) == 0)) &&
     (((*(ushort *)(lVar10 + 0x19) >> 7 & 1) == 0 && ((*(byte *)(lVar10 + 0x18) & 0x10) == 0)))) {
    in_stack_ffffffffffffff00 =
         (Index *)(*(long *)(piVar5 + 0x10) + (long)*(int *)(piVar5 + 10) * 0x38);
    in_stack_ffffffffffffff16 = estLog(0);
    for (in_stack_ffffffffffffff08 = *(Index **)(piVar5 + 0x10);
        in_stack_fffffffffffffedf =
             local_c4 == 0 && in_stack_ffffffffffffff08 < in_stack_ffffffffffffff00,
        local_c4 == 0 && in_stack_ffffffffffffff08 < in_stack_ffffffffffffff00;
        in_stack_ffffffffffffff08 = (Index *)&in_stack_ffffffffffffff08->aSortOrder) {
      if ((((ulong)in_stack_ffffffffffffff08->pNext & puVar2[1]) == 0) &&
         (iVar8 = termCanDriveIndex((WhereTerm *)in_stack_fffffffffffffec8,
                                    (SrcItem *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    (Bitmask)in_stack_fffffffffffffeb8), iVar8 != 0)) {
        *(undefined2 *)(puVar2 + 3) = 1;
        *(undefined2 *)((long)puVar2 + 0x36) = 0;
        puVar2[4] = 0;
        *(undefined2 *)((long)puVar2 + 0x34) = 1;
        *(Index **)puVar2[8] = in_stack_ffffffffffffff08;
        *(LogEst *)((long)puVar2 + 0x12) = in_stack_ffffffffffffff16 + sVar1;
        if ((pTVar4->eTabType == '\x02') || ((pTVar4->tabFlags & 0x4000) != 0)) {
          *(short *)((long)puVar2 + 0x12) = *(short *)((long)puVar2 + 0x12) + -0x19;
        }
        else {
          *(short *)((long)puVar2 + 0x12) = *(short *)((long)puVar2 + 0x12) + 0x1c;
        }
        if (*(short *)((long)puVar2 + 0x12) < 0) {
          *(undefined2 *)((long)puVar2 + 0x12) = 0;
        }
        *(undefined2 *)((long)puVar2 + 0x16) = 0x2b;
        LVar7 = sqlite3LogEstAdd(in_stack_ffffffffffffff16,*(LogEst *)((long)puVar2 + 0x16));
        *(LogEst *)((long)puVar2 + 0x14) = LVar7;
        *(undefined4 *)(puVar2 + 6) = 0x4000;
        *puVar2 = in_RSI | (ulong)in_stack_ffffffffffffff08->pNext;
        local_c4 = whereLoopInsert((WhereLoopBuilder *)
                                   CONCAT44(in_stack_fffffffffffffefc,
                                            CONCAT22(in_stack_fffffffffffffefa,
                                                     in_stack_fffffffffffffef8)),
                                   (WhereLoop *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
    }
  }
  while (uVar11 = local_c4 == 0 && local_a8 != (Index *)0x0,
        local_c4 == 0 && local_a8 != (Index *)0x0) {
    if (((local_a8->pPartIdxWhere == (Expr *)0x0) ||
        (iVar8 = whereUsablePartialIndex
                           (in_stack_fffffffffffffef0,(u8)((ulong)in_stack_fffffffffffffee8 >> 0x38)
                            ,in_stack_fffffffffffffee0,
                            (Expr *)CONCAT17(in_stack_fffffffffffffedf,
                                             CONCAT16(uVar11,CONCAT24(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8)))),
        iVar8 != 0)) && ((*(ushort *)&local_a8->field_0x63 >> 9 & 1) == 0)) {
      sVar1 = *local_a8->aiRowLogEst;
      *(undefined2 *)(puVar2 + 3) = 0;
      *(undefined2 *)((long)puVar2 + 0x1a) = 0;
      *(undefined2 *)((long)puVar2 + 0x1c) = 0;
      *(undefined2 *)((long)puVar2 + 0x36) = 0;
      *(undefined2 *)((long)puVar2 + 0x34) = 0;
      *(undefined1 *)((long)puVar2 + 0x11) = 0;
      *(undefined2 *)((long)puVar2 + 0x12) = 0;
      *puVar2 = in_RSI;
      *(short *)((long)puVar2 + 0x16) = sVar1;
      puVar2[4] = (ulong)local_a8;
      puVar2[5] = 0;
      iVar8 = indexMightHelpWithOrderBy
                        ((WhereLoopBuilder *)in_stack_fffffffffffffee8,
                         (Index *)in_stack_fffffffffffffee0,
                         CONCAT13(in_stack_fffffffffffffedf,
                                  CONCAT12(uVar11,in_stack_fffffffffffffedc)));
      if ((*(ushort *)&local_a8->field_0x63 & 3) == 3) {
        *(undefined4 *)(puVar2 + 6) = 0x100;
        in_stack_fffffffffffffed8 = local_c8;
        if (iVar8 == 0) {
          in_stack_fffffffffffffed8 = 0;
        }
        *(char *)((long)puVar2 + 0x11) = (char)in_stack_fffffffffffffed8;
        *(short *)((long)puVar2 + 0x14) = sVar1 + 0x10;
        whereLoopOutputAdjust
                  ((WhereClause *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8,(LogEst)((ulong)in_stack_fffffffffffffee0 >> 0x30));
        if ((*(ushort *)(lVar10 + 0x19) >> 2 & 1) != 0) {
          if ((*(ushort *)(lVar10 + 0x19) >> 6 & 1) != 0) {
            *(uint *)(puVar2 + 6) = (uint)puVar2[6] | 0x2000000;
          }
          puVar2[5] = *(ulong *)(**(long **)(lVar10 + 0x40) + 0x48);
        }
        local_c4 = whereLoopInsert((WhereLoopBuilder *)
                                   CONCAT44(in_stack_fffffffffffffefc,
                                            CONCAT22(in_stack_fffffffffffffefa,
                                                     in_stack_fffffffffffffef8)),
                                   (WhereLoop *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        *(short *)((long)puVar2 + 0x16) = sVar1;
joined_r0x00204736:
        if (local_c4 != 0) break;
      }
      else {
        if ((*(ushort *)&local_a8->field_0x63 >> 5 & 1) == 0) {
          in_stack_ffffffffffffff78 = (SrcItem *)(*(ulong *)(lVar10 + 0x20) & local_a8->colNotIdxed)
          ;
          if (local_a8->pPartIdxWhere != (Expr *)0x0) {
            wherePartIdxExpr((Parse *)CONCAT26(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,(Expr *)in_stack_ffffffffffffff00,
                             (Bitmask *)
                             CONCAT44(in_stack_fffffffffffffefc,
                                      CONCAT22(in_stack_fffffffffffffefa,in_stack_fffffffffffffef8))
                             ,in_stack_fffffffffffffef4,(SrcItem *)in_stack_fffffffffffffee8);
          }
          *(undefined4 *)(puVar2 + 6) = 0x200;
          if ((in_stack_ffffffffffffff78 == (SrcItem *)0x8000000000000000) ||
             ((((*(ushort *)&local_a8->field_0x63 >> 0xc & 1) != 0 &&
               ((*(ushort *)&local_a8->field_0x63 >> 0xb & 1) == 0)) &&
              (in_stack_ffffffffffffff78 != (SrcItem *)0x0)))) {
            in_stack_fffffffffffffefc =
                 whereIsCoveringIndex
                           ((WhereInfo *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
            if (in_stack_fffffffffffffefc != 0) {
              in_stack_ffffffffffffff78 = (SrcItem *)0x0;
              *(u32 *)(puVar2 + 6) = in_stack_fffffffffffffefc | (uint)puVar2[6];
            }
          }
          else if ((in_stack_ffffffffffffff78 == (SrcItem *)0x0) &&
                  ((((pTVar4->tabFlags & 0x80) == 0 || (*(long *)(pcVar3 + 0x20) != 0)) ||
                   (iVar9 = sqlite3FaultSim(in_stack_fffffffffffffec4), iVar9 != 0)))) {
            *(undefined4 *)(puVar2 + 6) = 0x240;
          }
        }
        else {
          in_stack_ffffffffffffff78 = (SrcItem *)0x0;
          *(undefined4 *)(puVar2 + 6) = 0x240;
        }
        if (((((iVar8 != 0) || ((pTVar4->tabFlags & 0x80) != 0)) ||
             (local_a8->pPartIdxWhere != (Expr *)0x0)) ||
            ((*(ushort *)(lVar10 + 0x19) >> 1 & 1) != 0)) ||
           (((in_stack_ffffffffffffff78 == (SrcItem *)0x0 &&
             ((*(ushort *)&local_a8->field_0x63 >> 2 & 1) == 0)) &&
            (((local_a8->szIdxRow < pTVar4->szTabRow &&
              (((*(ushort *)(pcVar3 + 0x3c) & 4) == 0 && (sqlite3Config.bUseCis != '\0')))) &&
             ((*(uint *)(**(long **)pcVar3 + 0x60) & 0x20) == 0)))))) {
          in_stack_fffffffffffffed4 = local_c8;
          if (iVar8 == 0) {
            in_stack_fffffffffffffed4 = 0;
          }
          *(char *)((long)puVar2 + 0x11) = (char)in_stack_fffffffffffffed4;
          in_stack_fffffffffffffed0 = sVar1 + 1;
          *(short *)((long)puVar2 + 0x14) =
               (short)in_stack_fffffffffffffed0 +
               (short)((local_a8->szIdxRow * 0xf) / (int)pTVar4->szTabRow);
          if (in_stack_ffffffffffffff78 != (SrcItem *)0x0) {
            in_stack_fffffffffffffef0 = *(int *)(lVar10 + 0x1c);
            in_stack_fffffffffffffee8 = (WhereLoop *)(pcVar3 + 0x68);
            in_stack_fffffffffffffefa = sVar1 + 0x10;
            for (in_stack_fffffffffffffef4 = 0; iVar8._0_2_ = in_stack_fffffffffffffee8->rRun,
                iVar8._2_2_ = in_stack_fffffffffffffee8->nOut, in_stack_fffffffffffffef4 < iVar8;
                in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 + 1) {
              in_stack_fffffffffffffee0 =
                   (WhereClause *)
                   (&((in_stack_fffffffffffffee8->u).btree.pIndex)->zName +
                   (long)in_stack_fffffffffffffef4 * 7);
              iVar8 = sqlite3ExprCoveredByIndex
                                ((Expr *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                                 in_stack_fffffffffffffeb8);
              if (iVar8 == 0) break;
              sVar6._0_1_ = in_stack_fffffffffffffee0->op;
              sVar6._1_1_ = in_stack_fffffffffffffee0->hasOr;
              if (sVar6 < 1) {
                sVar6 = in_stack_fffffffffffffefa + *(short *)&in_stack_fffffffffffffee0->op;
              }
              else {
                sVar6 = in_stack_fffffffffffffefa + -1;
                if ((in_stack_fffffffffffffee0->nTerm & 0x82) != 0) {
                  sVar6 = in_stack_fffffffffffffefa + -0x14;
                }
              }
              in_stack_fffffffffffffefa = sVar6;
            }
            LVar7 = sqlite3LogEstAdd(*(LogEst *)((long)puVar2 + 0x14),in_stack_fffffffffffffefa);
            *(LogEst *)((long)puVar2 + 0x14) = LVar7;
          }
          whereLoopOutputAdjust
                    ((WhereClause *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,(LogEst)((ulong)in_stack_fffffffffffffee0 >> 0x30));
          if (((*(byte *)(lVar10 + 0x18) & 0x10) == 0) || (local_a8->aColExpr == (ExprList *)0x0)) {
            local_c4 = whereLoopInsert((WhereLoopBuilder *)
                                       CONCAT44(in_stack_fffffffffffffefc,
                                                CONCAT22(in_stack_fffffffffffffefa,
                                                         in_stack_fffffffffffffef8)),
                                       (WhereLoop *)
                                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                      );
          }
          *(short *)((long)puVar2 + 0x16) = sVar1;
          goto joined_r0x00204736;
        }
      }
      *(undefined1 *)&in_RDI->zColAff = 0;
      local_c4 = whereLoopAddBtreeIndex
                           ((WhereLoopBuilder *)
                            CONCAT26(uVar14,CONCAT24(LVar13,CONCAT22(iVar12,
                                                  in_stack_ffffffffffffff80))),
                            in_stack_ffffffffffffff78,in_RDI,(LogEst)(in_RSI >> 0x30));
      if (*(char *)&in_RDI->zColAff == '\x01') {
        pTVar4->tabFlags = pTVar4->tabFlags | 0x100;
      }
    }
    if ((*(ushort *)(lVar10 + 0x19) >> 1 & 1) == 0) {
      in_stack_fffffffffffffec8 = local_a8->pNext;
    }
    else {
      in_stack_fffffffffffffec8 = (Index *)0x0;
    }
    local_c8 = local_c8 + 1;
    local_a8 = in_stack_fffffffffffffec8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c4;
  }
  __stack_chk_fail();
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequisites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  SrcItem *pSrc;              /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */

  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pSTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pSTab) );

  if( pSrc->fg.isIndexedBy ){
    assert( pSrc->fg.isCte==0 );
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->u2.pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = 3;  /* TUNING: Interior rows of IPK table are very small */
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pSTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & (WHERE_RIGHT_JOIN|WHERE_OR_SUBCLAUSE))==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && !pSrc->fg.isIndexedBy  /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
   && (pSrc->fg.jointype & JT_RIGHT)==0 /* Not the right tab of a RIGHT JOIN */
  ){
    /* Generate auto-index WhereLoops */
    LogEst rLogSize;         /* Logarithm of the number of rows in the table */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    rLogSize = estLog(rSize);
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( !IsView(pTab) && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 25;  /* Greatly reduced setup cost for auto indexes
                               ** on ephemeral materializations of views */
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe;
      pProbe=(pSrc->fg.isIndexedBy ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pSrc->fg.jointype, pWC,
                                 pProbe->pPartIdxWhere)
    ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    pNew->u.btree.pOrderBy = 0;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);

    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is 3.0*N.  The 3.0 factor is an
      ** extra cost designed to discourage the use of full table scans,
      ** since index lookups have better worst-case performance if our
      ** stat guesses are wrong.  Reduce the 3.0 penalty slightly
      ** (to 2.75) if we have valid STAT4 information for the table.
      ** At 2.75, a full table scan is preferred over using an index on
      ** a column with just two distinct values where each value has about
      ** an equal number of appearances.  Without STAT4 data, we still want
      ** to use an index in that case, since the constraint might be for
      ** the scarcer of the two values, and in that case an index lookup is
      ** better.
      */
#ifdef SQLITE_ENABLE_STAT4
      pNew->rRun = rSize + 16 - 2*((pTab->tabFlags & TF_HasStat4)!=0);
#else
      pNew->rRun = rSize + 16;
#endif
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      if( pSrc->fg.isSubquery ){
        if( pSrc->fg.viaCoroutine ) pNew->wsFlags |= WHERE_COROUTINE;
        pNew->u.btree.pOrderBy = pSrc->u4.pSubq->pSelect->pOrderBy;
      }
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        m = 0;
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        if( pProbe->pPartIdxWhere ){
          wherePartIdxExpr(
              pWInfo->pParse, pProbe, pProbe->pPartIdxWhere, &m, 0, 0
          );
        }
        pNew->wsFlags = WHERE_INDEXED;
        if( m==TOPBIT || (pProbe->bHasExpr && !pProbe->bHasVCol && m!=0) ){
          u32 isCov = whereIsCoveringIndex(pWInfo, pProbe, pSrc->iCursor);
          if( isCov==0 ){
            WHERETRACE(0x200,
               ("-> %s is not a covering index"
                " according to whereIsCoveringIndex()\n", pProbe->zName));
            assert( m!=0 );
          }else{
            m = 0;
            pNew->wsFlags |= isCov;
            if( isCov & WHERE_IDX_ONLY ){
              WHERETRACE(0x200,
                 ("-> %s is a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }else{
              assert( isCov==WHERE_EXPRIDX );
              WHERETRACE(0x200,
                 ("-> %s might be a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }
          }
        }else if( m==0
           && (HasRowid(pTab) || pWInfo->pSelect!=0 || sqlite3FaultSim(700))
        ){
          WHERETRACE(0x200,
             ("-> %s a covering index according to bitmasks\n",
             pProbe->zName, m==0 ? "is" : "is not"));
          pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        }
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || pSrc->fg.isIndexedBy
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }

          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        if( (pSrc->fg.jointype & JT_RIGHT)!=0 && pProbe->aColExpr ){
          /* Do not do an SCAN of a index-on-expression in a RIGHT JOIN
          ** because the cursor used to access the index might not be
          ** positioned to the correct row during the right-join no-match
          ** loop. */
        }else{
          rc = whereLoopInsert(pBuilder, pNew);
        }
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags1 = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags1==SQLITE_BLDF1_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_MaybeReanalyze;
    }
#ifdef SQLITE_ENABLE_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}